

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int removeNode(Rtree *pRtree,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  int iVar2;
  RtreeNode *pNode_00;
  int iCell;
  
  iVar1 = nodeParentIndex(pRtree,pNode,&iCell);
  if (iVar1 == 0) {
    pNode_00 = pNode->pParent;
    pNode->pParent = (RtreeNode *)0x0;
    iVar1 = deleteCell(pRtree,pNode_00,iCell,iHeight + 1);
  }
  else {
    pNode_00 = (RtreeNode *)0x0;
  }
  iVar2 = nodeRelease(pRtree,pNode_00);
  if (iVar1 != 0) {
    iVar2 = iVar1;
  }
  if (iVar2 == 0) {
    sqlite3_bind_int64(pRtree->pDeleteNode,1,pNode->iNode);
    sqlite3_step(pRtree->pDeleteNode);
    iVar2 = sqlite3_reset(pRtree->pDeleteNode);
    if (iVar2 == 0) {
      sqlite3_bind_int64(pRtree->pDeleteParent,1,pNode->iNode);
      sqlite3_step(pRtree->pDeleteParent);
      iVar2 = sqlite3_reset(pRtree->pDeleteParent);
      if (iVar2 == 0) {
        nodeHashDelete(pRtree,pNode);
        pNode->iNode = (long)iHeight;
        pNode->pNext = pRtree->pDeleted;
        pNode->nRef = pNode->nRef + 1;
        pRtree->pDeleted = pNode;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int removeNode(Rtree *pRtree, RtreeNode *pNode, int iHeight){
  int rc;
  int rc2;
  RtreeNode *pParent = 0;
  int iCell;

  assert( pNode->nRef==1 );

  /* Remove the entry in the parent cell. */
  rc = nodeParentIndex(pRtree, pNode, &iCell);
  if( rc==SQLITE_OK ){
    pParent = pNode->pParent;
    pNode->pParent = 0;
    rc = deleteCell(pRtree, pParent, iCell, iHeight+1);
  }
  rc2 = nodeRelease(pRtree, pParent);
  if( rc==SQLITE_OK ){
    rc = rc2;
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Remove the xxx_node entry. */
  sqlite3_bind_int64(pRtree->pDeleteNode, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteNode);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteNode)) ){
    return rc;
  }

  /* Remove the xxx_parent entry. */
  sqlite3_bind_int64(pRtree->pDeleteParent, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteParent);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteParent)) ){
    return rc;
  }
  
  /* Remove the node from the in-memory hash table and link it into
  ** the Rtree.pDeleted list. Its contents will be re-inserted later on.
  */
  nodeHashDelete(pRtree, pNode);
  pNode->iNode = iHeight;
  pNode->pNext = pRtree->pDeleted;
  pNode->nRef++;
  pRtree->pDeleted = pNode;

  return SQLITE_OK;
}